

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnDataSymbol
          (BinaryReaderIR *this,Index index,uint32_t flags,string_view name,Index segment,
          uint32_t offset,uint32_t size)

{
  Module *pMVar1;
  bool bVar2;
  size_type sVar3;
  reference ppDVar4;
  string_view name_00;
  Binding local_b8;
  BinaryReaderIR *local_90;
  size_t local_88;
  string local_80;
  undefined1 local_60 [8];
  string dollar_name;
  DataSegment *seg;
  Index segment_local;
  uint32_t flags_local;
  Index index_local;
  BinaryReaderIR *this_local;
  string_view name_local;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (BinaryReaderIR *)name._M_len;
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  if (bVar2) {
    Result::Result((Result *)((long)&name_local._M_str + 4),Ok);
  }
  else if ((flags & 0x10) == 0) {
    if (offset == 0) {
      sVar3 = std::vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>::size
                        (&this->module_->data_segments);
      if (segment < sVar3) {
        ppDVar4 = std::vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>::operator[]
                            (&this->module_->data_segments,(ulong)segment);
        dollar_name.field_2._8_8_ = *ppDVar4;
        pMVar1 = this->module_;
        local_90 = this_local;
        local_88 = name_local._M_len;
        name_00._M_str = (char *)dollar_name.field_2._8_8_;
        name_00._M_len = name_local._M_len;
        (anonymous_namespace)::MakeDollarName_abi_cxx11_
                  (&local_80,(_anonymous_namespace_ *)this_local,name_00);
        GetUniqueName((string *)local_60,this,&pMVar1->data_segment_bindings,&local_80);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::operator=
                  ((string *)(dollar_name.field_2._8_8_ + 8),(string *)local_60);
        pMVar1 = this->module_;
        Binding::Binding(&local_b8,segment);
        std::
        unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
        ::emplace<std::__cxx11::string&,wabt::Binding>
                  ((unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
                    *)&pMVar1->data_segment_bindings,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                   &local_b8);
        Result::Result((Result *)((long)&name_local._M_str + 4),Ok);
        std::__cxx11::string::~string((string *)local_60);
      }
      else {
        PrintError(this,"invalid data segment index: %u",(ulong)segment);
        Result::Result((Result *)((long)&name_local._M_str + 4),Error);
      }
    }
    else {
      Result::Result((Result *)((long)&name_local._M_str + 4),Ok);
    }
  }
  else {
    Result::Result((Result *)((long)&name_local._M_str + 4),Ok);
  }
  return (Result)name_local._M_str._4_4_;
}

Assistant:

Result BinaryReaderIR::OnDataSymbol(Index index,
                                    uint32_t flags,
                                    std::string_view name,
                                    Index segment,
                                    uint32_t offset,
                                    uint32_t size) {
  if (name.empty()) {
    return Result::Ok;
  }
  if (flags & WABT_SYMBOL_FLAG_UNDEFINED) {
    // Refers to data in another file, `segment` not valid.
    return Result::Ok;
  }
  if (offset) {
    // If it is pointing into the data segment, then it's not really naming
    // the whole segment.
    return Result::Ok;
  }
  if (segment >= module_->data_segments.size()) {
    PrintError("invalid data segment index: %" PRIindex, segment);
    return Result::Error;
  }
  DataSegment* seg = module_->data_segments[segment];
  std::string dollar_name =
      GetUniqueName(&module_->data_segment_bindings, MakeDollarName(name));
  seg->name = dollar_name;
  module_->data_segment_bindings.emplace(dollar_name, Binding(segment));
  return Result::Ok;
}